

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O3

void addMDDProp(vec<IntVar_*> *x,MDDTable *tab,MDDNodeInt m,MDDOpts *mopts)

{
  MDDTemplate *this;
  MDDProp<0> *this_00;
  ulong uVar1;
  IntView<0> local_78;
  vec<IntView<0>_> local_68;
  vec<int> local_58;
  vec<std::pair<int,_int>_> local_48;
  MDDTable *local_38;
  
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (IntView<0> *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (pair<int,_int> *)0x0;
  local_38 = tab;
  if (x->sz != 0) {
    uVar1 = 0;
    do {
      local_78.var = *(IntVar **)&x->data[uVar1]->min;
      vec<std::pair<int,_int>_>::push(&local_48,(pair<int,_int> *)&local_78);
      local_78.var = (IntVar *)CONCAT44(local_78.var._4_4_,(x->data[uVar1]->max).v + 1);
      vec<int>::push(&local_58,(int *)&local_78);
      uVar1 = uVar1 + 1;
    } while (uVar1 < x->sz);
    if (x->sz != 0) {
      uVar1 = 0;
      do {
        IntVar::specialiseToEL(x->data[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < x->sz);
      if (x->sz != 0) {
        uVar1 = 0;
        do {
          local_78.var = x->data[uVar1];
          local_78.a = 1;
          local_78.b = 0;
          vec<IntView<0>_>::push(&local_68,&local_78);
          uVar1 = uVar1 + 1;
        } while (uVar1 < x->sz);
      }
    }
  }
  this = (MDDTemplate *)operator_new(0x70);
  MDDTemplate::MDDTemplate(this,local_38,m,&local_58);
  this_00 = (MDDProp<0> *)operator_new(0xf0);
  MDDProp<0>::MDDProp(this_00,this,&local_68,mopts);
  if (local_48.data != (pair<int,_int> *)0x0) {
    free(local_48.data);
  }
  if (local_68.data != (IntView<0> *)0x0) {
    free(local_68.data);
  }
  if (local_58.data != (int *)0x0) {
    free(local_58.data);
  }
  return;
}

Assistant:

static void addMDDProp(vec<IntVar*>& x, MDDTable& tab, MDDNodeInt m, const MDDOpts& mopts) {
	vec<int> doms;
	vec<IntView<> > w;

	vec<intpair> bounds;
	for (unsigned int i = 0; i < x.size(); i++) {
		bounds.push(intpair(x[i]->getMin(), x[i]->getMax()));
		doms.push(x[i]->getMax() + 1);
		// assert( x[i]->getMin() == 0 );
	}
	//   m = tab.bound(m, bounds);
	//   m = tab.expand(0, m);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(IntView<>(x[i], 1, 0));
	}

	auto* templ = new MDDTemplate(tab, m, doms);

	new MDDProp<0>(templ, w, mopts);
}